

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O3

int Cec_ManSimulationOne(Gia_Man_t *pAig,Cec_ParSim_t *pPars)

{
  int iVar1;
  int iVar2;
  Cec_ManSim_t *p;
  long lVar3;
  int level;
  Cec_ManSim_t *pCVar4;
  long lVar5;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p = Cec_ManSimStart(pAig,pPars);
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    pCVar4 = p;
    iVar1 = Cec_ManSimClassesPrepare(p,-1);
    iVar2 = (int)pCVar4;
    if (iVar1 == 0) goto LAB_00647bc4;
  }
  else {
LAB_00647bc4:
    pCVar4 = p;
    iVar1 = Cec_ManSimClassesRefine(p);
    iVar2 = (int)pCVar4;
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_00647bff;
    }
  }
  Abc_Print(iVar2,"The number of failed outputs of the miter = %6d. (Words = %4d. Frames = %4d.)\n",
            (ulong)(uint)p->nOuts,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames);
LAB_00647bff:
  if (pPars->fVerbose != 0) {
    level = 3;
    iVar2 = clock_gettime(3,&local_38);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar3) / 1000000.0);
  }
  Cec_ManSimStop(p);
  return iVar1;
}

Assistant:

int Cec_ManSimulationOne( Gia_Man_t * pAig, Cec_ParSim_t * pPars )
{
    Cec_ManSim_t * pSim;
    int RetValue = 0;
    abctime clkTotal = Abc_Clock();
    pSim = Cec_ManSimStart( pAig, pPars );
    if ( (pAig->pReprs == NULL && (RetValue = Cec_ManSimClassesPrepare( pSim, -1 ))) ||
         (RetValue == 0 &&        (RetValue = Cec_ManSimClassesRefine( pSim ))) )
        Abc_Print( 1, "The number of failed outputs of the miter = %6d. (Words = %4d. Frames = %4d.)\n", 
            pSim->nOuts, pPars->nWords, pPars->nFrames );
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    Cec_ManSimStop( pSim );
    return RetValue;
}